

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImBezierClosestPointCasteljau
                 (ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImVec2 *p,float tess_tol)

{
  float p_closest_dist2;
  ImVec2 p_last;
  undefined1 local_1c [4];
  ImVec2 local_18;
  ImVec2 local_10;
  
  if (0.0 < tess_tol) {
    local_18 = *p1;
    local_10.x = 0.0;
    local_10.y = 0.0;
    local_1c = (undefined1  [4])0x7f7fffff;
    BezierClosestPointCasteljauStep
              (&local_10,&local_18,(ImVec2 *)local_1c,(float *)0x0,p->x,p->y,local_18.x,local_18.y,
               p2->x,p2->y,p3->x,p3->y,p4->x,(int)p);
    return local_10;
  }
  __assert_fail("tess_tol > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                ,0x4ea,
                "ImVec2 ImBezierClosestPointCasteljau(const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, const ImVec2 &, float)"
               );
}

Assistant:

ImVec2 ImBezierClosestPointCasteljau(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& p, float tess_tol)
{
    IM_ASSERT(tess_tol > 0.0f);
    ImVec2 p_last = p1;
    ImVec2 p_closest;
    float p_closest_dist2 = FLT_MAX;
    BezierClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, tess_tol, 0);
    return p_closest;
}